

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::LogUnused(cmMakefile *this,char *reason,string *name)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  string path;
  ostringstream msg;
  undefined1 auStack_1e8 [8];
  char *local_1e0;
  undefined8 local_1d8;
  char local_1d0;
  undefined7 uStack_1cf;
  string local_1c0;
  undefined1 local_1a0 [32];
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [4];
  ios_base local_130 [264];
  
  if (this->WarnUnused == true) {
    local_1d8 = 0;
    local_1d0 = '\0';
    local_1e0 = &local_1d0;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_1a0,&this->StateSnapshot);
      cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_1a0);
      std::__cxx11::string::_M_assign((string *)&local_1e0);
      std::__cxx11::string::append((char *)&local_1e0);
    }
    else {
      GetExecutionContext((cmListFileContext *)local_1a0,this);
      std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != local_170) {
        operator_delete(local_180._M_p,local_170[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
    }
    if ((this->CheckSystemVars != false) || (bVar1 = IsProjectFile(this,local_1e0), bVar1)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"unused variable (",0x11);
      if (reason == (char *)0x0) {
        std::ios::clear((int)auStack_1e8 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) + 0x48);
      }
      else {
        sVar2 = strlen(reason);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,reason,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,") \'",3);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
    }
    return;
  }
  return;
}

Assistant:

void cmMakefile::LogUnused(const char* reason, const std::string& name) const
{
  if (this->WarnUnused) {
    std::string path;
    if (!this->ExecutionStatusStack.empty()) {
      path = this->GetExecutionContext().FilePath;
    } else {
      path = this->GetCurrentSourceDirectory();
      path += "/CMakeLists.txt";
    }

    if (this->CheckSystemVars || this->IsProjectFile(path.c_str())) {
      std::ostringstream msg;
      msg << "unused variable (" << reason << ") \'" << name << "\'";
      this->IssueMessage(MessageType::AUTHOR_WARNING, msg.str());
    }
  }
}